

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loggingTest2.cpp
# Opt level: O3

void __thiscall LogTest2::Run(LogTest2 *this)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  
  iVar1 = this->mTest;
  if (iVar1 == 3) {
    pcVar3 = "void LogTest2::Test3()";
    pcVar4 = "Test3 is here to show what happens when an ASSERT_ERR fires.";
    uVar2 = 0x99;
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 == 1) {
        Test1(this);
      }
      goto LAB_00102429;
    }
    pcVar3 = "void LogTest2::Test2()";
    pcVar4 = "Test2 is here to show what happens when LOG_ERR_FATAL gets called.";
    uVar2 = 0x91;
  }
  jh_log_print(1,pcVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/loggingTest2.cpp"
               ,uVar2,pcVar4);
LAB_00102429:
  TestCase::TestPassed(&this->super_TestCase);
  return;
}

Assistant:

void LogTest2::Run()
{
	
	LOG_NOTICE( "LogTest2 Started" ); // Ignore this for now.
	switch( mTest )
	{
	case 1:
		Test1();
		break;
	case 2:
		Test2();
		break;
	case 3:
		Test3();
		break;
	}

	TestPassed();
}